

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

void __thiscall PrintStatement::evaluate(PrintStatement *this,SymTab *symTab)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar4;
  pointer ppEVar5;
  ulong uVar6;
  undefined1 *puVar7;
  TypeDescriptor **ppTVar8;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> array;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> testlist;
  TypeDescriptor typeDescriptor;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> local_e8;
  TypeDescriptor **local_d0;
  long local_c8;
  TypeDescriptor *local_c0 [2];
  pointer local_b0;
  SymTab *local_a8;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> local_a0;
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  size_type local_70;
  char local_68 [16];
  double local_58;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> local_50;
  types local_38;
  long lVar3;
  
  local_a8 = symTab;
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::vector(&local_a0,&this->_testlist->_list);
  local_b0 = local_a0.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_a0.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a0.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppEVar5 = local_a0.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar2 = (*(*ppEVar5)->_vptr_ExprNode[1])(*ppEVar5,local_a8);
      lVar3 = CONCAT44(extraout_var,iVar2);
      local_88._0_8_ = &PTR__TypeDescriptor_0011da98;
      local_88._8_8_ = *(double *)(lVar3 + 8);
      local_78._M_p = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,*(long *)(lVar3 + 0x10),
                 *(long *)(lVar3 + 0x18) + *(long *)(lVar3 + 0x10));
      local_58 = *(double *)(lVar3 + 0x30);
      std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector
                (&local_50,
                 (vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)(lVar3 + 0x38));
      local_38 = *(types *)(lVar3 + 0x50);
      if (local_38 == STRING) {
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_78._M_p,local_78._M_p + local_70);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if (local_d0 != local_c0) {
          puVar7 = (undefined1 *)((long)&local_c0[0]->_vptr_TypeDescriptor + 1);
          ppTVar8 = local_d0;
LAB_0011027d:
          operator_delete(ppTVar8,(ulong)puVar7);
        }
      }
      else if (local_38 == NUMBER) {
        poVar4 = std::ostream::_M_insert<double>((double)local_88._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      else {
        std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector
                  (&local_e8,&local_50);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
        if ((*local_e8.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
              _M_impl.super__Vector_impl_data._M_start)->_type == NUMBER) {
          if (local_e8.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_e8.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            uVar6 = 0;
            do {
              if (uVar6 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
              }
              std::ostream::_M_insert<double>
                        (local_e8.
                         super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar6]->_number);
              uVar6 = uVar6 + 1;
            } while (uVar6 < (ulong)((long)local_e8.
                                           super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_e8.
                                           super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
        }
        else if (local_e8.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish !=
                 local_e8.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                 _M_impl.super__Vector_impl_data._M_start) {
          uVar6 = 0;
          do {
            if (uVar6 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
            }
            pcVar1 = (local_e8.
                      super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar6]->_string)._M_dataplus._M_p;
            local_d0 = local_c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,pcVar1,
                       pcVar1 + (local_e8.
                                 super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar6]->_string).
                                _M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_d0,local_c8);
            if (local_d0 != local_c0) {
              operator_delete(local_d0,(ulong)((long)&local_c0[0]->_vptr_TypeDescriptor + 1));
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < (ulong)((long)local_e8.
                                         super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_e8.
                                         super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
        if (local_e8.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl
            .super__Vector_impl_data._M_start != (TypeDescriptor **)0x0) {
          puVar7 = (undefined1 *)
                   ((long)local_e8.
                          super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                   (long)local_e8.
                         super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>.
                         _M_impl.super__Vector_impl_data._M_start);
          ppTVar8 = local_e8.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_0011027d;
        }
      }
      TypeDescriptor::~TypeDescriptor((TypeDescriptor *)local_88);
      ppEVar5 = ppEVar5 + 1;
    } while (ppEVar5 != local_b0);
  }
  if (local_a0.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrintStatement::evaluate(SymTab &symTab) {
    //std::cout << "----PRINT-START---- \n";
    std::vector<ExprNode*>testlist = testList()->getTestlist();
    for (ExprNode *exprNode : testlist) {
        TypeDescriptor typeDescriptor = *exprNode->evaluate(symTab);
        if(typeDescriptor.type() == TypeDescriptor::NUMBER)
            std::cout << typeDescriptor.getNumber() << " " << std::endl;
        else if(typeDescriptor.type() == TypeDescriptor::STRING)
            std::cout << typeDescriptor.getString() << " " << std::endl;
        else { //ARRAY
            std::vector<TypeDescriptor*>array = typeDescriptor.getArray();
            std::cout << "[";
            if(array[0]->type() == TypeDescriptor::NUMBER) {
                for (int i = 0; i < array.size(); i++) {
                    if(i != 0) std::cout << ", ";
                    std::cout << array[i]->getNumber();
                }
            } else{ // String Elements
                for (int i = 0; i < array.size(); i++) {
                    if(i != 0) std::cout << ", ";
                    std::cout << array[i]->getString();
                }
            }
            std::cout << "]";//<< std::endl;
        }
    }
    //std::cout << "-----PRINT-END----- \n";
}